

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O1

void aec_get_rsi_msb_32(aec_stream *strm)

{
  uint uVar1;
  uint32_t *puVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  
  puVar2 = strm->state->data_raw;
  puVar3 = strm->next_in;
  uVar4 = strm->block_size * strm->rsi;
  strm->next_in = puVar3 + (int)(uVar4 * 4);
  strm->avail_in = strm->avail_in - (long)(int)(uVar4 * 4);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      uVar1 = *(uint *)(puVar3 + uVar5 * 4);
      puVar2[uVar5] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void aec_get_rsi_msb_32(struct aec_stream *strm)
{
    int i;
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    strm->next_in += 4 * rsi;
    strm->avail_in -= 4 * rsi;

    for (i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[4 * i] << 24)
            | ((uint32_t)in[4 * i + 1] << 16)
            | ((uint32_t)in[4 * i + 2] << 8)
            | (uint32_t)in[4 * i + 3];
}